

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

SampledSpectrum
pbrt::
SampleT_maj<pbrt::HomogeneousMedium,pbrt::SimpleVolPathIntegrator::Li(pbrt::RayDifferential,pbrt::SampledWavelengths&,pbrt::Sampler,pbrt::ScratchBuffer&,pbrt::VisibleSurface*)const::__0>
          (Ray *ray,Float tMax,Float u,RNG *rng,SampledWavelengths *lambda,
          anon_class_72_9_7ef62656 callback)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SampledSpectrum sigma_maj;
  Point3f p;
  array<float,_4> aVar3;
  bool bVar4;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar5;
  HomogeneousMedium *pHVar6;
  RayMajorantSegment *pRVar7;
  Float *pFVar8;
  RayMajorantSegment *pRVar9;
  long in_RDI;
  float in_XMM0_Da;
  type tVar10;
  Float FVar11;
  undefined8 uVar19;
  undefined1 auVar20 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float in_XMM1_Da;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar30 [56];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  Vector3<float> VVar31;
  Point3f PVar32;
  SampledSpectrum SVar33;
  Float dt_1;
  MediumProperties mp;
  Float t;
  Float tMin;
  Float dt;
  optional<pbrt::RayMajorantSegment> seg;
  bool done;
  SampledSpectrum T_maj;
  MajorantIterator iter;
  HomogeneousMedium *medium;
  undefined4 in_stack_fffffffffffffc08;
  Float in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  Float in_stack_fffffffffffffc14;
  undefined1 in_stack_fffffffffffffc18 [16];
  Vector3<float> in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  undefined4 in_stack_fffffffffffffc58;
  Float in_stack_fffffffffffffc5c;
  float in_stack_fffffffffffffc60;
  Float in_stack_fffffffffffffc64;
  Ray *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  float in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  anon_class_72_9_7ef62656 *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  Float in_stack_fffffffffffffd3c;
  RayMajorantSegment *in_stack_fffffffffffffd40;
  RayMajorantSegment *in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd70;
  undefined8 local_268;
  undefined8 local_260;
  float local_144;
  float local_120;
  Float local_10c;
  optional local_108 [31];
  byte local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  HomogeneousMedium *local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_5c;
  float local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  float local_20;
  float local_1c;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar24 [64];
  
  local_48 = *(undefined4 *)(in_RDI + 0x14);
  local_50 = *(undefined8 *)(in_RDI + 0xc);
  local_40 = local_50;
  local_38 = local_48;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  tVar10 = Length<float>(in_stack_fffffffffffffc38);
  local_1c = local_1c * tVar10;
  local_70 = *(undefined4 *)(in_RDI + 0x14);
  local_78 = *(undefined8 *)(in_RDI + 0xc);
  auVar20 = ZEXT856(0);
  VVar31.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffc5c;
  VVar31.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffc58;
  VVar31.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc60;
  local_68 = local_78;
  local_60 = local_70;
  VVar31 = Normalize<float>(VVar31);
  local_80 = VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar20;
  local_88 = vmovlpd_avx(auVar12._0_16_);
  *(undefined8 *)(in_RDI + 0xc) = local_88;
  *(float *)(in_RDI + 0x14) = local_80;
  local_5c = local_88;
  local_54 = local_80;
  pHVar6 = TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
           ::Cast<pbrt::HomogeneousMedium>
                     ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
                       *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  local_90 = pHVar6;
  Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
           (Ray *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  HomogeneousMedium::SampleRay
            ((HomogeneousMedium *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
             (SampledWavelengths *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0c);
  local_e9 = 0;
  do {
    if (((local_e9 ^ 0xff) & 1) == 0) {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 in_stack_fffffffffffffc0c);
      break;
    }
    HomogeneousMajorantIterator::Next(in_stack_fffffffffffffc18._0_8_);
    bVar4 = pstd::optional::operator_cast_to_bool(local_108);
    if (bVar4) {
      pRVar7 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                         ((optional<pbrt::RayMajorantSegment> *)0x80f975);
      pFVar8 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                          (int)in_stack_fffffffffffffc0c);
      if ((*pFVar8 != 0.0) || (NAN(*pFVar8))) {
        pRVar9 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x80fb43);
        local_144 = pRVar9->tMin;
        while( true ) {
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x80fb95);
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (int)in_stack_fffffffffffffc0c);
          FVar11 = SampleExponential(0.0,1.184526e-38);
          local_144 = local_144 + FVar11;
          local_20 = RNG::Uniform<float>((RNG *)CONCAT44(in_stack_fffffffffffffc14,
                                                         in_stack_fffffffffffffc10));
          pRVar9 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                             ((optional<pbrt::RayMajorantSegment> *)0x80fc37);
          if (pRVar9->tMax <= local_144) break;
          auVar22._8_4_ = 0x80000000;
          auVar22._0_8_ = &DAT_8000000080000000;
          auVar22._12_4_ = 0x80000000;
          auVar30 = ZEXT856(auVar22._8_8_);
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x80fc9a);
          auVar20 = (undefined1  [56])0x0;
          SVar33 = operator*(in_stack_fffffffffffffc14,
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          auVar26._0_8_ = SVar33.values.values._8_8_;
          auVar26._8_56_ = auVar30;
          auVar15._0_8_ = SVar33.values.values._0_8_;
          auVar15._8_56_ = auVar20;
          vmovlpd_avx(auVar15._0_16_);
          vmovlpd_avx(auVar26._0_16_);
          SVar33 = FastExp((SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          auVar27._0_8_ = SVar33.values.values._8_8_;
          auVar27._8_56_ = auVar30;
          auVar16._0_8_ = SVar33.values.values._0_8_;
          auVar16._8_56_ = auVar20;
          vmovlpd_avx(auVar16._0_16_);
          vmovlpd_avx(auVar27._0_16_);
          SampledSpectrum::operator*=
                    (in_stack_fffffffffffffc18._8_8_,in_stack_fffffffffffffc18._0_8_);
          uVar19 = 0;
          PVar32 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc64,
                                                   in_stack_fffffffffffffc60),
                                   in_stack_fffffffffffffc5c);
          auVar2._8_8_ = uVar19;
          auVar2._0_8_ = PVar32.super_Tuple3<pbrt::Point3,_float>._0_8_;
          vmovlpd_avx(auVar2);
          PVar32.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffc74;
          PVar32.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffc70;
          PVar32.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc78;
          HomogeneousMedium::SamplePoint
                    ((HomogeneousMedium *)
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),PVar32,
                     (SampledWavelengths *)
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          uVar19 = 0;
          PVar32 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffc64,
                                                   in_stack_fffffffffffffc60),
                                   in_stack_fffffffffffffc5c);
          in_stack_fffffffffffffc74 = PVar32.super_Tuple3<pbrt::Point3,_float>.z;
          in_stack_fffffffffffffc78 = PVar32.super_Tuple3<pbrt::Point3,_float>.x;
          auVar1._8_8_ = uVar19;
          auVar1._0_8_ = PVar32.super_Tuple3<pbrt::Point3,_float>._0_8_;
          vmovlpd_avx(auVar1);
          MediumProperties::MediumProperties
                    ((MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (MediumProperties *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          pstd::optional<pbrt::RayMajorantSegment>::operator->
                    ((optional<pbrt::RayMajorantSegment> *)0x80fe79);
          p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd70;
          p.super_Tuple3<pbrt::Point3,_float>._0_8_ = pHVar6;
          sigma_maj.values.values._8_8_ = pRVar7;
          sigma_maj.values.values._0_8_ = in_stack_fffffffffffffd48;
          SVar33.values.values[1] = in_stack_fffffffffffffd3c;
          SVar33.values.values[0] = (float)in_stack_fffffffffffffd38;
          SVar33.values.values._8_8_ = in_stack_fffffffffffffd40;
          bVar4 = SimpleVolPathIntegrator::Li::anon_class_72_9_7ef62656::operator()
                            (in_stack_fffffffffffffd30,p,
                             (MediumProperties *)
                             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),sigma_maj
                             ,SVar33);
          in_stack_fffffffffffffc64 = (Float)CONCAT13(bVar4,SUB43(in_stack_fffffffffffffc64,0));
          if (!bVar4) {
            local_e9 = 1;
            goto LAB_00810084;
          }
          SampledSpectrum::SampledSpectrum
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     in_stack_fffffffffffffc0c);
          local_e8 = local_268;
          uStack_e0 = local_260;
        }
        pRVar7 = pstd::optional<pbrt::RayMajorantSegment>::operator->
                           ((optional<pbrt::RayMajorantSegment> *)0x80ff86);
        in_stack_fffffffffffffc58 = SUB84(pRVar7,0);
        in_stack_fffffffffffffc5c = (Float)((ulong)pRVar7 >> 0x20);
        in_stack_fffffffffffffc57 = IsInf<float>(0.0);
        if ((bool)in_stack_fffffffffffffc57) {
          std::numeric_limits<float>::max();
        }
        auVar23._8_4_ = 0x80000000;
        auVar23._0_8_ = &DAT_8000000080000000;
        auVar23._12_4_ = 0x80000000;
        auVar30 = ZEXT856(auVar23._8_8_);
        pstd::optional<pbrt::RayMajorantSegment>::operator->
                  ((optional<pbrt::RayMajorantSegment> *)0x810002);
        auVar20 = (undefined1  [56])0x0;
        SVar33 = operator*(in_stack_fffffffffffffc14,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        auVar28._0_8_ = SVar33.values.values._8_8_;
        auVar28._8_56_ = auVar30;
        auVar17._0_8_ = SVar33.values.values._0_8_;
        auVar17._8_56_ = auVar20;
        vmovlpd_avx(auVar17._0_16_);
        vmovlpd_avx(auVar28._0_16_);
        SVar33 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        auVar29._0_8_ = SVar33.values.values._8_8_;
        auVar29._8_56_ = auVar30;
        auVar18._0_8_ = SVar33.values.values._0_8_;
        auVar18._8_56_ = auVar20;
        in_stack_fffffffffffffc18 = auVar29._0_16_;
        vmovlpd_avx(auVar18._0_16_);
        vmovlpd_avx(in_stack_fffffffffffffc18);
        SampledSpectrum::operator*=(auVar30._0_8_,auVar29._0_8_);
LAB_00810084:
        local_10c = 0.0;
      }
      else {
        in_stack_fffffffffffffd48 =
             pstd::optional<pbrt::RayMajorantSegment>::operator->
                       ((optional<pbrt::RayMajorantSegment> *)0x80f9b7);
        in_stack_fffffffffffffd3c = in_stack_fffffffffffffd48->tMax;
        in_stack_fffffffffffffd40 =
             pstd::optional<pbrt::RayMajorantSegment>::operator->
                       ((optional<pbrt::RayMajorantSegment> *)0x80f9e4);
        local_120 = in_stack_fffffffffffffd3c - in_stack_fffffffffffffd40->tMin;
        eVar5 = IsInf<float>(0.0);
        in_stack_fffffffffffffd38 = CONCAT13(eVar5,(int3)in_stack_fffffffffffffd38);
        if (eVar5) {
          local_120 = std::numeric_limits<float>::max();
        }
        auVar21._8_4_ = 0x80000000;
        auVar21._0_8_ = &DAT_8000000080000000;
        auVar21._12_4_ = 0x80000000;
        auVar30 = ZEXT856(auVar21._8_8_);
        in_stack_fffffffffffffd2c = -local_120;
        in_stack_fffffffffffffd30 =
             (anon_class_72_9_7ef62656 *)
             pstd::optional<pbrt::RayMajorantSegment>::operator->
                       ((optional<pbrt::RayMajorantSegment> *)0x80fa96);
        auVar20 = (undefined1  [56])0x0;
        SVar33 = operator*(in_stack_fffffffffffffc14,
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        auVar24._0_8_ = SVar33.values.values._8_8_;
        auVar24._8_56_ = auVar30;
        auVar13._0_8_ = SVar33.values.values._0_8_;
        auVar13._8_56_ = auVar20;
        vmovlpd_avx(auVar13._0_16_);
        vmovlpd_avx(auVar24._0_16_);
        SVar33 = FastExp((SampledSpectrum *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        auVar25._0_8_ = SVar33.values.values._8_8_;
        auVar25._8_56_ = auVar30;
        auVar14._0_8_ = SVar33.values.values._0_8_;
        auVar14._8_56_ = auVar20;
        vmovlpd_avx(auVar14._0_16_);
        vmovlpd_avx(auVar25._0_16_);
        SampledSpectrum::operator*=(in_stack_fffffffffffffc18._8_8_,in_stack_fffffffffffffc18._0_8_)
        ;
        local_10c = 2.8026e-45;
      }
    }
    else {
      local_10 = local_e8;
      local_8 = uStack_e0;
      local_10c = 1.4013e-45;
    }
    pstd::optional<pbrt::RayMajorantSegment>::~optional
              ((optional<pbrt::RayMajorantSegment> *)0x81009c);
    in_stack_fffffffffffffc14 = local_10c;
  } while ((local_10c == 0.0) || (local_10c != 1.4013e-45));
  aVar3.values[2] = (float)(undefined4)local_8;
  aVar3.values[3] = (float)local_8._4_4_;
  aVar3.values[0] = (float)(undefined4)local_10;
  aVar3.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum SampleT_maj(Ray ray, Float tMax, Float u, RNG &rng,
                                         const SampledWavelengths &lambda, F callback) {
    // Normalize ray direction and update _tMax_ accordingly
    tMax *= Length(ray.d);
    ray.d = Normalize(ray.d);

    // Initialize _MajorantIterator_ for ray majorant sampling
    ConcreteMedium *medium = ray.medium.Cast<ConcreteMedium>();
    typename ConcreteMedium::MajorantIterator iter = medium->SampleRay(ray, tMax, lambda);

    // Generate ray majorant samples until termination
    SampledSpectrum T_maj(1.f);
    bool done = false;
    while (!done) {
        // Get next majorant segment from iterator and sample it
        pstd::optional<RayMajorantSegment> seg = iter.Next();
        if (!seg)
            return T_maj;
        // Handle zero-valued majorant for current segment
        if (seg->sigma_maj[0] == 0) {
            Float dt = seg->tMax - seg->tMin;
            // Handle infinite _dt_ for ray majorant segment
            if (IsInf(dt))
                dt = std::numeric_limits<Float>::max();

            T_maj *= FastExp(-dt * seg->sigma_maj);
            continue;
        }

        // Generate samples along current majorant segment
        Float tMin = seg->tMin;
        while (true) {
            // Try to generate sample along current majorant segment
            Float t = tMin + SampleExponential(u, seg->sigma_maj[0]);
            PBRT_DBG("Sampled t = %f from tMin %f u %f sigma_maj[0] %f\n", t, tMin, u,
                     seg->sigma_maj[0]);
            u = rng.Uniform<Float>();
            if (t < seg->tMax) {
                // Call callback function for sample within segment
                PBRT_DBG("t < seg->tMax\n");
                T_maj *= FastExp(-(t - tMin) * seg->sigma_maj);
                MediumProperties mp = medium->SamplePoint(ray(t), lambda);
                if (!callback(ray(t), mp, seg->sigma_maj, T_maj)) {
                    // Returning out of doubly-nested while loop is not as good perf. wise
                    // on the GPU vs using "done" here.
                    done = true;
                    break;
                }
                T_maj = SampledSpectrum(1.f);
                tMin = t;

            } else {
                // Handle sample past end of majorant segment
                Float dt = seg->tMax - tMin;
                // Handle infinite _dt_ for ray majorant segment
                if (IsInf(dt))
                    dt = std::numeric_limits<Float>::max();

                T_maj *= FastExp(-dt * seg->sigma_maj);
                PBRT_DBG("Past end, added dt %f * maj[0] %f\n", dt, seg->sigma_maj[0]);
                break;
            }
        }
    }
    return SampledSpectrum(1.f);
}